

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1write.c
# Opt level: O1

int mbedtls_asn1_write_tagged_string(uchar **p,uchar *start,int tag,char *text,size_t text_len)

{
  uchar *puVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  size_t len;
  
  puVar1 = *p;
  len = 0xffffff94;
  if (text_len <= (ulong)((long)puVar1 - (long)start) && start <= puVar1) {
    *p = puVar1 + -text_len;
    memcpy(puVar1 + -text_len,text,text_len);
    len = text_len & 0xffffffff;
  }
  iVar4 = (int)len;
  iVar3 = iVar4;
  if ((-1 < iVar4) && (iVar2 = mbedtls_asn1_write_len(p,start,len), iVar3 = iVar2, -1 < iVar2)) {
    puVar1 = *p;
    if ((long)puVar1 - (long)start < 1) {
      iVar3 = -0x6c;
    }
    else {
      *p = puVar1 + -1;
      puVar1[-1] = (uchar)tag;
      iVar3 = 1;
    }
    if (puVar1 != start && -1 < (long)puVar1 - (long)start) {
      iVar3 = iVar2 + iVar4 + iVar3;
    }
  }
  return iVar3;
}

Assistant:

int mbedtls_asn1_write_tagged_string( unsigned char **p, unsigned char *start, int tag,
    const char *text, size_t text_len )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t len = 0;

    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_raw_buffer( p, start,
        (const unsigned char *) text, text_len ) );

    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_len( p, start, len ) );
    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_tag( p, start, tag ) );

    return( (int) len );
}